

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void andres::marray_detail::
     operate<andres::marray_detail::Assign<float,float>,float,std::allocator<unsigned_long>,andres::BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<float,false,std::allocator<unsigned_long>>,float,andres::marray_detail::Plus<int,float,float>>,float>
               (View<float,_false,_std::allocator<unsigned_long>_> *v,
               BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Plus<int,_float,_float>_>
               *expression)

{
  long *plVar1;
  CoordinateOrder CVar2;
  View<int,_false,_std::allocator<unsigned_long>_> *this;
  pointer piVar3;
  long lVar4;
  unsigned_long uVar5;
  bool bVar6;
  size_t sVar7;
  size_t sVar8;
  runtime_error *prVar9;
  pointer pfVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  ulong uVar15;
  pointer pfVar16;
  pointer puVar17;
  ulong uVar18;
  Marray<float,_std::allocator<unsigned_long>_> m;
  allocator_type local_c1;
  long local_c0;
  long local_b8;
  View<float,_false,_std::allocator<unsigned_long>_> *local_b0;
  View<int,_false,_std::allocator<unsigned_long>_> *local_a8;
  View<float,_false,_std::allocator<unsigned_long>_> *local_a0;
  long local_98;
  reference local_90;
  reference local_88;
  size_t local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  long local_50;
  long local_48;
  
  if (((v->geometry_).size_ == 0) ||
     ((expression->e2_->geometry_).size_ == 0 && (expression->e1_->geometry_).size_ == 0)) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"Assertion failed.");
  }
  else {
    sVar7 = BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Plus<int,_float,_float>_>
            ::dimension(expression);
    if (v->data_ == (pointer)0x0) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar9,"Assertion failed.");
    }
    else if (sVar7 == (v->geometry_).dimension_) {
      if (sVar7 == 0) {
        if ((v->geometry_).size_ == 1) {
          uVar18 = (expression->e1_->geometry_).size_;
          uVar15 = (expression->e2_->geometry_).size_;
          if (uVar15 < uVar18) {
            uVar15 = uVar18;
          }
          if (uVar15 == 1) {
LAB_001209cd:
            bVar6 = BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<float,false,std::allocator<unsigned_long>>,float,andres::marray_detail::Plus<int,float,float>>
                    ::overlaps<float,false,std::allocator<unsigned_long>>
                              ((BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<float,false,std::allocator<unsigned_long>>,float,andres::marray_detail::Plus<int,float,float>>
                                *)expression,v);
            if (bVar6) {
              Marray<float,std::allocator<unsigned_long>>::
              Marray<andres::BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<float,false,std::allocator<unsigned_long>>,float,andres::marray_detail::Plus<int,float,float>>,float>
                        ((Marray<float,std::allocator<unsigned_long>> *)&local_78,
                         (ViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Plus<int,_float,_float>_>,_float>
                          *)expression,&local_c1);
              operate<andres::marray_detail::Assign<float,float>,float,float,false,std::allocator<unsigned_long>>
                        (v,&local_78);
              operator_delete((void *)CONCAT44(local_78.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               local_78.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_),
                              local_48 << 2);
              uVar18 = local_50 * 0x18;
              puVar17 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
LAB_00120cbd:
              operator_delete(puVar17,uVar18);
              return;
            }
            if (v->data_ == (pointer)0x0) {
              prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar9,"Assertion failed.");
            }
            else {
              if ((v->geometry_).dimension_ == 0) {
                *v->data_ = (float)*expression->e1_->data_ + *expression->e2_->data_;
                return;
              }
              View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
              if (((v->geometry_).isSimple_ == true) &&
                 (bVar6 = BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Plus<int,_float,_float>_>
                          ::isSimple(expression), bVar6)) {
                View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
                CVar2 = (v->geometry_).coordinateOrder_;
                this = expression->e1_;
                View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(this);
                if (CVar2 == (this->geometry_).coordinateOrder_) {
                  sVar7 = (v->geometry_).size_;
                  if (sVar7 != 0) {
                    pfVar10 = v->data_;
                    piVar3 = expression->e1_->data_;
                    pfVar16 = expression->e2_->data_;
                    sVar8 = 0;
                    do {
                      pfVar10[sVar8] = (float)piVar3[sVar8] + pfVar16[sVar8];
                      sVar8 = sVar8 + 1;
                    } while (sVar7 != sVar8);
                    return;
                  }
                  return;
                }
              }
              local_a8 = expression->e1_;
              local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ = 0;
              local_88 = AccessOperatorHelper<true>::
                         execute<int,int,false,std::allocator<unsigned_long>>
                                   (local_a8,(int *)&local_78);
              local_b0 = expression->e2_;
              local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ = 0;
              local_90 = AccessOperatorHelper<true>::
                         execute<float,int,false,std::allocator<unsigned_long>>
                                   (local_b0,(int *)&local_78);
              if (v->data_ != (pointer)0x0) {
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                          (&local_78,(v->geometry_).dimension_,(allocator_type *)&local_c1);
                pfVar10 = v->data_;
                if (pfVar10 == (pointer)0x0) {
                  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar9,"Assertion failed.");
                  __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                local_80 = (v->geometry_).dimension_ - 1;
                local_98 = 0;
                local_b8 = 0;
                local_c0 = 0;
                pfVar16 = pfVar10;
                local_a0 = v;
                do {
                  *pfVar10 = (float)local_88[local_c0] + local_90[local_b8];
                  if ((v->geometry_).dimension_ != 0) {
                    sVar7 = 0;
                    do {
                      lVar4 = *(long *)(CONCAT44(local_78.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 local_78.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                       sVar7 * 8);
                      sVar8 = View<float,_false,_std::allocator<unsigned_long>_>::shape(v,sVar7);
                      v = local_a0;
                      if (lVar4 + 1U != sVar8) {
                        sVar8 = View<float,_false,_std::allocator<unsigned_long>_>::strides
                                          (local_a0,sVar7);
                        lVar4 = local_98;
                        sVar11 = View<int,_false,_std::allocator<unsigned_long>_>::strides
                                           (local_a8,sVar7);
                        sVar12 = View<float,_false,_std::allocator<unsigned_long>_>::strides
                                           (local_b0,sVar7);
                        local_c0 = local_c0 + sVar11;
                        local_b8 = local_b8 + sVar12;
                        local_98 = lVar4 + sVar8;
                        plVar1 = (long *)(CONCAT44(local_78.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_78.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                         sVar7 * 8);
                        *plVar1 = *plVar1 + 1;
                        pfVar16 = v->data_;
                        break;
                      }
                      puVar17 = (pointer)CONCAT44(local_78.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_78.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_);
                      if (local_80 == sVar7) {
                        if (puVar17 == (pointer)0x0) {
                          return;
                        }
                        uVar18 = (long)local_78.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)puVar17;
                        goto LAB_00120cbd;
                      }
                      uVar5 = puVar17[sVar7];
                      sVar8 = View<float,_false,_std::allocator<unsigned_long>_>::strides
                                        (local_a0,sVar7);
                      sVar11 = View<int,_false,_std::allocator<unsigned_long>_>::strides
                                         (local_a8,sVar7);
                      sVar12 = View<int,_false,_std::allocator<unsigned_long>_>::shape
                                         (local_a8,sVar7);
                      sVar13 = View<float,_false,_std::allocator<unsigned_long>_>::strides
                                         (local_b0,sVar7);
                      sVar14 = View<float,_false,_std::allocator<unsigned_long>_>::shape
                                         (local_b0,sVar7);
                      *(undefined8 *)
                       (CONCAT44(local_78.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 local_78.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_4_) + sVar7 * 8) = 0;
                      pfVar16 = local_a0->data_;
                      if (pfVar16 == (pointer)0x0) {
                        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(prVar9,"Assertion failed.");
                        __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      local_c0 = local_c0 - (sVar12 - 1) * sVar11;
                      local_b8 = local_b8 - (sVar14 - 1) * sVar13;
                      local_98 = local_98 - sVar8 * uVar5;
                      sVar7 = sVar7 + 1;
                      v = local_a0;
                    } while (sVar7 < (local_a0->geometry_).dimension_);
                  }
                  pfVar10 = pfVar16 + local_98;
                } while( true );
              }
              prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar9,"Assertion failed.");
            }
            goto LAB_00120d0d;
          }
        }
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar9,"Assertion failed.");
      }
      else {
        uVar18 = 0;
        do {
          if ((v->geometry_).dimension_ <= uVar18) goto LAB_001209cd;
          sVar7 = View<float,_false,_std::allocator<unsigned_long>_>::shape(v,uVar18);
          sVar8 = BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Plus<int,_float,_float>_>
                  ::shape(expression,uVar18);
          if (sVar7 != sVar8) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar9,"Assertion failed.");
            goto LAB_00120d0d;
          }
          uVar18 = uVar18 + 1;
        } while (v->data_ != (pointer)0x0);
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar9,"Assertion failed.");
      }
    }
    else {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar9,"Assertion failed.");
    }
  }
LAB_00120d0d:
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void operate
(
    View<T1, false, A>& v, 
    const ViewExpression<E, T2>& expression, 
    Functor f
)
{
    const E& e = expression; // cast
    if(!MARRAY_NO_DEBUG) {
        Assert(v.size() != 0 && e.size() != 0);
        Assert(e.dimension() == v.dimension());
        if(v.dimension() == 0) {
            Assert(v.size() == 1 && e.size() == 1);
        }
        else {
            for(std::size_t j=0; j<v.dimension(); ++j) {
                Assert(v.shape(j) == e.shape(j));
            }
        }
    }
    if(e.overlaps(v)) {
        Marray<T1, A> m(e); // temporary copy
        operate(v, m, f);
    }
    else if(v.dimension() == 0) {
        f(v[0], e[0]);
    }
    else if(v.isSimple() && e.isSimple() 
    && v.coordinateOrder() == e.coordinateOrder()) {
        for(std::size_t j=0; j<v.size(); ++j) {
            f(v[j], e[j]);
        }
    }
    else {
        // loop unrolling does not improve performance here
        typename E::ExpressionIterator itE(e);
        std::size_t offsetV = 0;
        std::vector<std::size_t> coordinate(v.dimension());
        std::size_t maxDimension = v.dimension() - 1;
        for(;;) {
            f(v[offsetV], *itE);
            for(std::size_t j=0; j<v.dimension(); ++j) {
                if(coordinate[j]+1 == v.shape(j)) {
                    if(j == maxDimension) {
                        return;
                    }
                    else {
                        offsetV -= coordinate[j] * v.strides(j);
                        itE.resetCoordinate(j);
                        coordinate[j] = 0;
                    }
                }
                else {
                    offsetV += v.strides(j);
                    itE.incrementCoordinate(j);
                    ++coordinate[j];
                    break;
                }
            }
        }
    }
}